

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int ffhist(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
          double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
          char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  double dVar1;
  double dVar2;
  fitsfile *fptr_00;
  char (*templt) [71];
  iteratorCol *piVar3;
  iteratorCol *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  fitsfile **ppfVar9;
  char *pcVar10;
  char *pcVar11;
  undefined4 uVar15;
  double *pdVar12;
  long lVar13;
  byte bVar14;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  int nkeys;
  double binsize [4];
  double amin [4];
  double datamax;
  long haxes [4];
  char card [81];
  double datamin;
  double maxbin [4];
  double amax [4];
  histType histData;
  char keyname [75];
  char errmsg [81];
  char cpref [4] [71];
  char svalue [71];
  int local_5c4;
  double local_5c0;
  fitsfile *local_5b8;
  fitsfile **local_5b0;
  ulong local_5a8;
  char (*local_5a0) [71];
  int local_598;
  int local_594;
  iteratorCol *local_590;
  int local_584;
  int local_580;
  int local_57c;
  double local_578 [4];
  double local_558 [4];
  char *local_538;
  double *local_530;
  long local_528;
  double local_520;
  long local_518 [4];
  char local_4f8 [96];
  double local_498;
  char *local_490;
  long local_488;
  iteratorCol *local_480;
  iteratorCol *local_478;
  double local_470;
  double local_468 [4];
  double local_448 [4];
  undefined1 local_428 [8];
  fitsfile *local_420;
  int local_418;
  int local_414 [4];
  int local_404;
  long local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  double local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  double local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  double local_3a0;
  double local_398;
  undefined8 local_390;
  undefined8 local_388;
  int local_358;
  int local_354 [3];
  double local_348;
  char *local_340;
  char local_2f8 [80];
  iteratorCol local_2a8;
  char local_198 [71];
  char local_151 [71];
  char local_10a [71];
  char local_c3 [75];
  undefined1 local_78 [72];
  
  local_470 = -9.1191291391491e-36;
  local_520 = -9.1191291391491e-36;
  if (0 < *status) {
    return *status;
  }
  if (4 < naxis) {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
    return 0x140;
  }
  fptr_00 = *fptr;
  local_5b0 = fptr;
  local_498 = weightin;
  local_490 = outfile;
  if (fptr_00->HDUposition != fptr_00->Fptr->curhdu) {
    ffmahd(fptr_00,fptr_00->HDUposition + 1,(int *)0x0,status);
  }
  local_420 = *local_5b0;
  local_340 = selectrow;
  if (imagetype < 0x1f) {
    local_580 = 8;
    if (imagetype != 0xb) {
      if (imagetype != 0x15) {
LAB_001c3bd5:
        *status = 0x19a;
        return 0x19a;
      }
      local_580 = 0x10;
    }
  }
  else if (imagetype == 0x1f) {
    local_580 = 0x20;
  }
  else if (imagetype == 0x2a) {
    local_580 = -0x20;
  }
  else {
    if (imagetype != 0x52) goto LAB_001c3bd5;
    local_580 = -0x40;
  }
  local_5c4 = 0;
  local_538 = local_198;
  local_5a0 = colname;
  local_584 = imagetype;
  local_418 = naxis;
  local_404 = imagetype;
  ffgky(local_420,0x10,"CPREF",local_538,(char *)0x0,&local_5c4);
  if (local_5c4 == 0) {
    pcVar11 = local_198;
LAB_001c3bc0:
    if (*pcVar11 == '\0') goto LAB_001c34ce;
    if (*pcVar11 != ',') goto code_r0x001c3bd0;
    *pcVar11 = '\0';
    do {
      pcVar10 = pcVar11 + 1;
      pcVar11 = pcVar11 + 1;
    } while (*pcVar10 == ' ');
    pcVar10 = local_151;
    strcpy(pcVar10,pcVar11);
    while( true ) {
      if (*pcVar10 == '\0') goto LAB_001c34ce;
      if (*pcVar10 == ',') break;
      pcVar10 = pcVar10 + 1;
    }
    *pcVar10 = '\0';
    do {
      pcVar11 = pcVar10 + 1;
      pcVar10 = pcVar10 + 1;
    } while (*pcVar11 == ' ');
    pcVar11 = local_10a;
    strcpy(pcVar11,pcVar10);
LAB_001c3c52:
    if (*pcVar11 != '\0') {
      if (*pcVar11 != ',') goto code_r0x001c3c68;
      *pcVar11 = '\0';
      do {
        pcVar10 = pcVar11 + 1;
        pcVar11 = pcVar11 + 1;
      } while (*pcVar10 == ' ');
      strcpy(local_c3,pcVar11);
    }
  }
LAB_001c34ce:
  local_530 = minin;
  if (0 < naxis) {
    local_488 = (ulong)(uint)naxis << 3;
    local_528 = 0;
    lVar13 = 0;
    bVar14 = 0;
    local_5a8 = 0;
    local_598 = 0;
    ppfVar9 = local_5b0;
    do {
      if ((*(char *)&((iteratorCol *)minname)->fptr != '\0') &&
         (iVar5 = ffgky(*ppfVar9,0x52,*minname,(void *)((long)local_530 + lVar13),(char *)0x0,status
                       ), iVar5 != 0)) {
        ffpmsg("error reading histogramming minimum keyword");
        goto LAB_001c3f0b;
      }
      local_590 = (iteratorCol *)minname;
      if ((*(char *)&((iteratorCol *)maxname)->fptr != '\0') &&
         (iVar5 = ffgky(*ppfVar9,0x52,*maxname,(void *)((long)maxin + lVar13),(char *)0x0,status),
         iVar5 != 0)) {
        ffpmsg("error reading histogramming maximum keyword");
        wtcol = *maxname;
        goto LAB_001c3e78;
      }
      if ((*(char *)&((iteratorCol *)binname)->fptr != '\0') &&
         (iVar5 = ffgky(*ppfVar9,0x52,*binname,(void *)((long)binsizein + lVar13),(char *)0x0,status
                       ), iVar5 != 0)) {
        ffpmsg("error reading histogramming binsize keyword");
        wtcol = *binname;
        goto LAB_001c3e78;
      }
      templt = local_5a0;
      if ((*(double *)((long)binsizein + lVar13) == 0.0) &&
         (!NAN(*(double *)((long)binsizein + lVar13)))) {
        ffpmsg("error: histogram binsize = 0");
        *status = 0x142;
        return 0x142;
      }
      local_478 = (iteratorCol *)maxname;
      if (((*local_5a0)[0] == '\0') &&
         (strcpy(*local_5a0,local_538), local_5a8 < 4 && (*templt)[0] == '\0')) {
        *(short *)*templt = (short)(0x54005a00590058 >> (bVar14 & 0x3f));
      }
      iVar5 = ffgcno(*ppfVar9,0,*templt,(int *)((long)local_414 + local_528),status);
      if (0 < iVar5) {
        wtcol = (char *)&local_2a8;
        builtin_strncpy(local_2a8.colname + 0x14,"t exist: ",10);
        builtin_strncpy(local_2a8.colname + 4,"gram axis doesn\'",0x10);
        local_2a8.fptr = (fitsfile *)0x66206e6d756c6f63;
        local_2a8.colnum = 0x6820726f;
        builtin_strncpy(local_2a8.colname,"isto",4);
        sVar8 = strlen(wtcol);
        strncat(wtcol,*local_5a0,0x50 - sVar8);
        goto LAB_001c3e78;
      }
      if (1 < (int)(*ppfVar9)->Fptr->tableptr[(long)local_414[local_5a8] + -1].trepeat) {
        builtin_strncpy(local_2a8.colname + 4,"or column: ",0xc);
        uVar15._0_1_ = 'C';
        uVar15._1_1_ = 'a';
        uVar15._2_1_ = 'n';
        uVar15._3_1_ = '\'';
        uVar16._0_1_ = 't';
        uVar16._1_1_ = ' ';
        uVar16._2_1_ = 'b';
        uVar16._3_1_ = 'i';
        local_2a8.colnum._0_1_ = 'n';
        local_2a8.colnum._1_1_ = ' ';
        local_2a8.colnum._2_1_ = 'a';
        local_2a8.colnum._3_1_ = ' ';
        local_2a8.colname[0] = 'v';
        local_2a8.colname[1] = 'e';
        local_2a8.colname[2] = 'c';
        local_2a8.colname[3] = 't';
LAB_001c3d1d:
        local_2a8.fptr = (fitsfile *)CONCAT44(uVar16,uVar15);
        sVar8 = strlen((char *)&local_2a8);
        strncat((char *)&local_2a8,*local_5a0,0x50 - sVar8);
        ffpmsg((char *)&local_2a8);
        *status = 0x19a;
        return 0x19a;
      }
      ffeqty(*ppfVar9,local_414[local_5a8],&local_594,(long *)0x0,(long *)0x0,status);
      if ((local_594 < 0) || (local_594 == 0x10)) {
        builtin_strncpy(local_2a8.colname + 0x14,"n this column: ",0xf);
        local_2a8.colname._35_4_ = local_2a8.colname._35_4_ & 0xffffff00;
        builtin_strncpy(local_2a8.colname + 4,"tatype; can\'t bi",0x10);
        uVar15._0_1_ = 'I';
        uVar15._1_1_ = 'n';
        uVar15._2_1_ = 'a';
        uVar15._3_1_ = 'p';
        uVar16._0_1_ = 'p';
        uVar16._1_1_ = 'r';
        uVar16._2_1_ = 'o';
        uVar16._3_1_ = 'p';
        local_2a8.colnum._0_1_ = 'r';
        local_2a8.colnum._1_1_ = 'i';
        local_2a8.colnum._2_1_ = 'a';
        local_2a8.colnum._3_1_ = 't';
        local_2a8.colname[0] = 'e';
        local_2a8.colname[1] = ' ';
        local_2a8.colname[2] = 'd';
        local_2a8.colname[3] = 'a';
        goto LAB_001c3d1d;
      }
      dVar1 = *(double *)((long)local_530 + lVar13);
      if ((dVar1 == -9.1191291391491e-36) && (!NAN(dVar1))) {
        ffkeyn("TLMIN",local_414[local_5a8],local_2f8,status);
        iVar5 = ffgky(*ppfVar9,0x52,local_2f8,(double *)((long)local_558 + lVar13),(char *)0x0,
                      status);
        if (iVar5 < 1) goto LAB_001c378b;
        *status = 0;
        iVar5 = fits_get_col_minmax(*ppfVar9,local_414[local_5a8],
                                    (double *)((long)local_558 + lVar13),&local_520,status);
        if (iVar5 < 1) goto LAB_001c378b;
LAB_001c3eba:
        minname = (char (*) [71])&local_2a8;
        builtin_strncpy(local_2a8.colname,"ating datamin and datamax for column: ",0x27);
        local_2a8.fptr = (fitsfile *)0x616320726f727245;
        local_2a8.colnum = 0x6c75636c;
        sVar8 = strlen((char *)minname);
        strncat((char *)minname,*local_5a0,0x50 - sVar8);
LAB_001c3f0b:
        ffpmsg(*minname);
        return *status;
      }
      *(double *)((long)local_558 + lVar13) = dVar1;
LAB_001c378b:
      dVar1 = *(double *)((long)maxin + lVar13);
      local_480 = (iteratorCol *)binname;
      if ((dVar1 != -9.1191291391491e-36) || (NAN(dVar1))) {
        *(double *)((long)local_448 + lVar13) = dVar1;
      }
      else {
        ffkeyn("TLMAX",local_414[local_5a8],local_2f8,status);
        pdVar12 = (double *)((long)local_448 + lVar13);
        iVar5 = ffgky(*ppfVar9,0x52,local_2f8,pdVar12,(char *)0x0,status);
        ppfVar9 = local_5b0;
        local_598 = 1;
        if (0 < iVar5) {
          *status = 0;
          if ((local_520 != -9.1191291391491e-36) || (NAN(local_520))) {
            *pdVar12 = local_520;
          }
          else {
            iVar5 = fits_get_col_minmax(*local_5b0,local_414[local_5a8],&local_470,pdVar12,status);
            if (0 < iVar5) goto LAB_001c3eba;
          }
        }
      }
      pdVar12 = (double *)((long)binsizein + lVar13);
      if ((*pdVar12 == -9.1191291391491e-36) && (!NAN(*pdVar12))) {
        local_5c4 = 0;
        ffkeyn("TDBIN",local_414[local_5a8],local_2f8,&local_5c4);
        iVar5 = ffgky(*ppfVar9,0x52,local_2f8,pdVar12,(char *)0x0,&local_5c4);
        if ((0 < iVar5) &&
           (dVar1 = (*(double *)((long)local_448 + lVar13) - *(double *)((long)local_558 + lVar13))
                    / 10.0, *pdVar12 = dVar1, 1.0 < dVar1)) {
          *pdVar12 = 1.0;
        }
      }
      dVar1 = *(double *)((long)local_558 + lVar13);
      dVar2 = *(double *)((long)local_448 + lVar13);
      if (((dVar2 < dVar1) && (0.0 < *pdVar12)) ||
         ((dVar1 < dVar2 && (*pdVar12 <= 0.0 && *pdVar12 != 0.0)))) {
        dVar17 = -*pdVar12;
      }
      else {
        dVar17 = *pdVar12;
      }
      *(double *)((long)local_578 + lVar13) = dVar17;
      piVar4 = local_478;
      piVar3 = local_480;
      if (local_594 < 0x2a) {
        if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1)))
        goto LAB_001c3a1d;
        if ((dVar2 != (double)(int)dVar2) || (NAN(dVar2) || NAN((double)(int)dVar2)))
        goto LAB_001c3a1d;
        if ((dVar17 != (double)(int)dVar17) || (NAN(dVar17) || NAN((double)(int)dVar17)))
        goto LAB_001c3a1d;
        iVar5 = ((int)dVar2 - (int)dVar1) / (int)dVar17 + 1;
        *(long *)((long)local_518 + lVar13) = (long)iVar5;
        *(double *)((long)local_468 + lVar13) = (double)iVar5 + 1.0;
        if (dVar2 <= dVar1) {
          *(double *)((long)local_558 + lVar13) = dVar1 + 0.5;
          dVar2 = dVar2 + -0.5;
        }
        else {
          *(double *)((long)local_558 + lVar13) = dVar1 + -0.5;
          dVar2 = dVar2 + 0.5;
        }
        *(double *)((long)local_448 + lVar13) = dVar2;
        goto LAB_001c3af7;
      }
LAB_001c3a1d:
      dVar18 = (dVar2 - dVar1) / dVar17;
      *(double *)((long)local_468 + lVar13) = dVar18;
      if (local_598 == 0) {
        lVar7 = (long)dVar18;
        *(long *)((long)local_518 + lVar13) = lVar7;
        dVar17 = (double)lVar7 * dVar17 + dVar1;
        if (dVar2 <= dVar1) {
          if (dVar2 < dVar17) goto LAB_001c3aec;
        }
        else if (dVar17 < dVar2) {
LAB_001c3aec:
          lVar7 = lVar7 + 1;
          goto LAB_001c3aef;
        }
      }
      else {
        lVar7 = (long)(dVar18 + 1.0);
LAB_001c3aef:
        *(long *)((long)local_518 + lVar13) = lVar7;
      }
LAB_001c3af7:
      local_5a8 = local_5a8 + 1;
      bVar14 = bVar14 + 0x10;
      lVar13 = lVar13 + 8;
      local_528 = local_528 + 4;
      local_538 = local_538 + 0x47;
      local_5a0 = local_5a0 + 1;
      binname = (char (*) [71])(piVar3->colname + 0x3b);
      maxname = (char (*) [71])(piVar4->colname + 0x3b);
      minname = (char (*) [71])(local_590->colname + 0x3b);
    } while (local_488 != lVar13);
  }
  if (*wtcol == '\0') {
    local_348 = local_498;
LAB_001c3d6a:
    if ((local_348 <= 0.0) && ((local_348 != -9.1191291391491e-36 || (NAN(local_348))))) {
      ffpmsg("Illegal histogramming weighting factor <= 0.");
      *status = 0x7d;
      return 0x7d;
    }
    if ((recip != 0) && ((local_348 != -9.1191291391491e-36 || (NAN(local_348))))) {
      local_348 = 1.0 / local_348;
    }
    local_358 = recip;
    iVar5 = ffinit(&local_5b8,local_490,status);
    ppfVar9 = local_5b0;
    if (iVar5 < 1) {
      iVar5 = ffcrim(local_5b8,local_580,local_418,local_518,status);
      if (iVar5 < 1) {
        iVar5 = 0;
        ffghsp(*ppfVar9,&local_57c,(int *)0x0,status);
        if (0 < local_57c) {
          do {
            iVar5 = iVar5 + 1;
            ffgrec(*local_5b0,iVar5,local_4f8,status);
            iVar6 = ffgkcl(local_4f8);
            if (0x77 < iVar6) {
              ffprec(local_5b8,local_4f8,status);
            }
          } while (iVar5 < local_57c);
        }
        local_3e0 = local_558[0];
        local_3c0 = local_468[0];
        local_3a0 = local_578[0];
        local_400 = local_518[0];
        if (1 < local_418) {
          local_3d8 = local_558[1];
          local_3b8 = local_468[1];
          local_398 = local_578[1];
          local_3f8 = local_518[1];
          if (local_418 != 2) {
            local_3d0 = local_558[2];
            local_3b0 = local_468[2];
            local_390 = local_578[2];
            local_3f0 = local_518[2];
            if (3 < local_418) {
              local_3c8 = local_558[3];
              local_3a8 = local_468[3];
              local_388 = local_578[3];
              local_3e8 = local_518[3];
            }
          }
        }
        fits_iter_set_file(&local_2a8,local_5b8);
        fits_iter_set_datatype(&local_2a8,local_584);
        fits_iter_set_iotype(&local_2a8,2);
        iVar5 = ffiter(1,&local_2a8,0,-1,ffwritehisto,local_428,status);
        if (iVar5 == 0) {
          if (0 < local_418) {
            lVar13 = 0;
            do {
              local_5c4 = 0;
              ffkeyn("TCTYP",local_414[lVar13],local_2f8,&local_5c4);
              ppfVar9 = local_5b0;
              ffgky(*local_5b0,0x10,local_2f8,local_78,(char *)0x0,&local_5c4);
              if (local_5c4 != 0) {
                local_5c4 = 0;
                ffkeyn("TTYPE",local_414[lVar13],local_2f8,&local_5c4);
                ffgky(*ppfVar9,0x10,local_2f8,local_78,(char *)0x0,&local_5c4);
              }
              iVar5 = (int)lVar13;
              if (local_5c4 == 0) {
                ffkeyn("CTYPE",iVar5 + 1,local_2f8,&local_5c4);
                ffpky(local_5b8,0x10,local_2f8,local_78,"Coordinate Type",&local_5c4);
              }
              else {
                local_5c4 = 0;
              }
              ffkeyn("TCUNI",local_414[lVar13],local_2f8,&local_5c4);
              ppfVar9 = local_5b0;
              ffgky(*local_5b0,0x10,local_2f8,local_78,(char *)0x0,&local_5c4);
              if (local_5c4 != 0) {
                local_5c4 = 0;
                ffkeyn("TUNIT",local_414[lVar13],local_2f8,&local_5c4);
                ffgky(*ppfVar9,0x10,local_2f8,local_78,(char *)0x0,&local_5c4);
              }
              if (local_5c4 == 0) {
                ffkeyn("CUNIT",iVar5 + 1,local_2f8,&local_5c4);
                ffpky(local_5b8,0x10,local_2f8,local_78,"Coordinate Units",&local_5c4);
              }
              else {
                local_5c4 = 0;
              }
              ffkeyn("TCRPX",local_414[lVar13],local_2f8,&local_5c4);
              ffgky(*local_5b0,0x52,local_2f8,&local_5c0,(char *)0x0,&local_5c4);
              if (local_5c4 == 0) {
                local_5c0 = (local_5c0 - local_558[lVar13]) / local_578[lVar13] + 0.5;
              }
              else {
                local_5c0 = 1.0;
                local_5c4 = 0;
              }
              lVar7 = lVar13 + 1;
              ffkeyn("CRPIX",(int)lVar7,local_2f8,&local_5c4);
              ffpky(local_5b8,0x52,local_2f8,&local_5c0,"Reference Pixel",&local_5c4);
              ffkeyn("TCRVL",local_414[lVar13],local_2f8,&local_5c4);
              ffgky(*local_5b0,0x52,local_2f8,&local_5c0,(char *)0x0,&local_5c4);
              if (local_5c4 != 0) {
                local_5c0 = local_578[lVar13] * 0.5 + local_558[lVar13];
                local_5c4 = 0;
              }
              ffkeyn("CRVAL",iVar5 + 1,local_2f8,&local_5c4);
              ffpky(local_5b8,0x52,local_2f8,&local_5c0,"Reference Value",&local_5c4);
              ffkeyn("TCDLT",local_414[lVar13],local_2f8,&local_5c4);
              ffgky(*local_5b0,0x52,local_2f8,&local_5c0,(char *)0x0,&local_5c4);
              if (local_5c4 != 0) {
                local_5c0 = 1.0;
                local_5c4 = 0;
              }
              local_5c0 = local_5c0 * local_578[lVar13];
              ffkeyn("CDELT",iVar5 + 1,local_2f8,&local_5c4);
              ffpky(local_5b8,0x52,local_2f8,&local_5c0,"Pixel size",&local_5c4);
              if (lVar13 == 1) {
                ffkeyn("TCROT",local_414[1],local_2f8,&local_5c4);
                ffgky(*local_5b0,0x52,local_2f8,&local_5c0,(char *)0x0,&local_5c4);
                if ((local_5c4 != 0) || ((local_5c0 == 0.0 && (!NAN(local_5c0))))) {
                  local_5c4 = 0;
                  ffkeyn("TCROT",local_414[0],local_2f8,&local_5c4);
                  ffgky(*local_5b0,0x52,local_2f8,&local_5c0,(char *)0x0,&local_5c4);
                  if ((local_5c4 != 0) || ((local_5c0 == 0.0 && (!NAN(local_5c0)))))
                  goto LAB_001c45a0;
                  local_5c0 = -local_5c0;
                }
                ffkeyn("CROTA",2,local_2f8,&local_5c4);
                ffpky(local_5b8,0x52,local_2f8,&local_5c0,"Rotation angle",&local_5c4);
              }
LAB_001c45a0:
              lVar13 = lVar7;
            } while (lVar7 < local_418);
            if (local_418 == 2) {
              local_5c4 = 0;
              ffkeyn("TP",local_414[0],local_4f8,&local_5c4);
              sVar8 = strlen(local_4f8);
              (local_4f8 + sVar8)[0] = '_';
              (local_4f8 + sVar8)[1] = '\0';
              ffkeyn(local_4f8,local_414[0],local_2f8,&local_5c4);
              ppfVar9 = local_5b0;
              ffgky(*local_5b0,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                ffpky(local_5b8,0x52,"PC1_1",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              local_2f8[1] = 0x43;
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                local_5c0 = local_578[0] * local_5c0;
                ffpky(local_5b8,0x52,"CD1_1",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              ffkeyn("TP",local_414[0],local_4f8,&local_5c4);
              sVar8 = strlen(local_4f8);
              (local_4f8 + sVar8)[0] = '_';
              (local_4f8 + sVar8)[1] = '\0';
              ffkeyn(local_4f8,local_414[1],local_2f8,&local_5c4);
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                ffpky(local_5b8,0x52,"PC1_2",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              local_2f8[1] = 0x43;
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                local_5c0 = local_578[0] * local_5c0;
                ffpky(local_5b8,0x52,"CD1_2",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              ffkeyn("TP",local_414[1],local_4f8,&local_5c4);
              sVar8 = strlen(local_4f8);
              (local_4f8 + sVar8)[0] = '_';
              (local_4f8 + sVar8)[1] = '\0';
              ffkeyn(local_4f8,local_414[0],local_2f8,&local_5c4);
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                ffpky(local_5b8,0x52,"PC2_1",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              local_2f8[1] = 0x43;
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                local_5c0 = local_578[1] * local_5c0;
                ffpky(local_5b8,0x52,"CD2_1",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              ffkeyn("TP",local_414[1],local_4f8,&local_5c4);
              sVar8 = strlen(local_4f8);
              (local_4f8 + sVar8)[0] = '_';
              (local_4f8 + sVar8)[1] = '\0';
              ffkeyn(local_4f8,local_414[1],local_2f8,&local_5c4);
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                ffpky(local_5b8,0x52,"PC2_2",&local_5c0,local_4f8,&local_5c4);
              }
              local_5c4 = 0;
              local_2f8[1] = 0x43;
              ffgky(*ppfVar9,0x52,local_2f8,&local_5c0,local_4f8,&local_5c4);
              if (local_5c4 == 0) {
                local_5c0 = local_578[1] * local_5c0;
                ffpky(local_5b8,0x52,"CD2_2",&local_5c0,local_4f8,&local_5c4);
              }
            }
          }
          ppfVar9 = local_5b0;
          ffclos(*local_5b0,status);
          *ppfVar9 = local_5b8;
        }
      }
      else {
        ffpmsg("failed to create primary array histogram in temp file");
        ffclos(local_5b8,status);
      }
      goto LAB_001c3e7d;
    }
    wtcol = "failed to create temp output file for histogram";
  }
  else {
    iVar5 = ffgky(*local_5b0,0x52,wtcol,&local_348,(char *)0x0,status);
    if (iVar5 == 0) goto LAB_001c3d6a;
    *status = 0;
    iVar5 = ffgcno(*local_5b0,0,wtcol,local_354,status);
    if (iVar5 < 1) {
      local_348 = -9.1191291391491e-36;
      goto LAB_001c3d6a;
    }
    ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
  }
LAB_001c3e78:
  ffpmsg(wtcol);
LAB_001c3e7d:
  return *status;
code_r0x001c3bd0:
  pcVar11 = pcVar11 + 1;
  goto LAB_001c3bc0;
code_r0x001c3c68:
  pcVar11 = pcVar11 + 1;
  goto LAB_001c3c52;
}

Assistant:

int ffhist(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    int ii, datatype, repeat, imin, imax, ibin, bitpix, tstatus, use_datamax = 0;
    long haxes[4];
    fitsfile *histptr;
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD], card[FLEN_CARD];
    tcolumn *colptr;
    iteratorCol imagepars[1];
    int n_cols = 1, nkeys;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    histType histData;    /* Structure holding histogram info for iterator */
    
    double amin[4], amax[4], binsize[4], maxbin[4];
    double datamin = DOUBLENULLVALUE, datamax = DOUBLENULLVALUE;
    char svalue[FLEN_VALUE];
    double dvalue;
    char cpref[4][FLEN_VALUE];
    char *cptr;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    histData.tblptr     = *fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else
        return(*status = BAD_DATATYPE);

    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    tstatus = 0;
    ffgky(*fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    for (ii = 0; ii < naxis; ii++)
    {

      /* get the min, max, and binsize values from keywords, if specified */

      if (*minname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (*maxname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (*binname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      if (*colname[ii] == '\0')
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      if (ffgcno(*fptr, CASEINSEN, colname[ii], histData.hcolnum+ii, status)
              > 0)
      {
        strcpy(errmsg, "column for histogram axis doesn't exist: ");
        strncat(errmsg, colname[ii], FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status);
      }

      colptr = ((*fptr)->Fptr)->tableptr;
      colptr += (histData.hcolnum[ii] - 1);

      repeat = (int) colptr->trepeat;  /* vector repeat factor of the column */
      if (repeat > 1)
      {
        strcpy(errmsg, "Can't bin a vector column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* get the datatype of the column */
      fits_get_eqcoltype(*fptr, histData.hcolnum[ii], &datatype,
         NULL, NULL, status);

      if (datatype < 0 || datatype == TSTRING)
      {
        strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* use TLMINn and TLMAXn keyword values if min and max were not given */
      /* else use actual data min and max if TLMINn and TLMAXn don't exist */
 
      if (minin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMIN", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      }
      else
      {
        amin[ii] = (double) minin[ii];
      }

      if (maxin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMAX", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */
      }
      else
      {
        amax[ii] = (double) maxin[ii];
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] == DOUBLENULLVALUE)
      {
         tstatus = 0;
         ffkeyn("TDBIN", histData.hcolnum[ii], keyname, &tstatus);

         if (ffgky(*fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus) > 0)
         {
	    /* make at least 10 bins */
            binsizein[ii] = (amax[ii] - amin[ii]) / 10. ;
            if (binsizein[ii] > 1.)
                binsizein[ii] = 1.;  /* use default bin size */
         }
      }

      if ( (amin[ii] > amax[ii] && binsizein[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsizein[ii] < 0. ) )
          binsize[ii] = (double) -binsizein[ii];  /* reverse the sign of binsize */
      else
          binsize[ii] =  (double) binsizein[ii];  /* binsize has the correct sign */

      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
 	                       (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        maxbin[ii] = (double) (haxes[ii] + 1.);  /* add 1. instead of .5 to avoid roundoff */

        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii]; 
        haxes[ii] = (long) (maxbin[ii] + 1);
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii];
        haxes[ii] = (long) maxbin[ii];

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

       /* get the histogramming weighting factor */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &histData.weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &histData.wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(*status);
            }

            histData.weight = DOUBLENULLVALUE;
        }
    }
    else
        histData.weight = (double) weightin;

    if (histData.weight <= 0. && histData.weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        return(*status = URL_PARSE_ERROR);
    }

    if (recip && histData.weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       histData.weight = (double) (1.0 / histData.weight);

    histData.wtrecip = recip;
        
    /* size of histogram is now known, so create temp output file */
    if (ffinit(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(*status);
    }

    if (ffcrim(histptr, bitpix, histData.haxis, haxes, status) > 0)
    {
        ffpmsg("failed to create primary array histogram in temp file");
        ffclos(histptr, status);
        return(*status);
    }

    /* copy all non-structural keywords from the table to the image */
    fits_get_hdrspace(*fptr, &nkeys, NULL, status);
    for (ii = 1; ii <= nkeys; ii++)
    {
       fits_read_record(*fptr, ii, card, status);
       if (fits_get_keyclass(card) >= 120)
           fits_write_record(histptr, card, status);
    }           

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.amin1 = amin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = binsize[0];
    histData.haxis1 = haxes[0];

    if (histData.haxis > 1)
    {
      histData.amin2 = amin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = binsize[1];
      histData.haxis2 = haxes[1];

      if (histData.haxis > 2)
      {
        histData.amin3 = amin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = binsize[2];
        histData.haxis3 = haxes[2];

        if (histData.haxis > 3)
        {
          histData.amin4 = amin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = binsize[3];
          histData.haxis4 = haxes[3];
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    if (fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status) )
         return(*status);

    /* write the World Coordinate System (WCS) keywords */
    /* create default values if WCS keywords are not present in the table */
    for (ii = 0; ii < histData.haxis; ii++)
    {
     /*  CTYPEn  */
       tstatus = 0;
       ffkeyn("TCTYP", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {               /* just use column name as the type */
          tstatus = 0;
          ffkeyn("TTYPE", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
       }
       else
          tstatus = 0;

     /*  CUNITn  */
       ffkeyn("TCUNI", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {         /* use the column units */
          tstatus = 0;
          ffkeyn("TUNIT", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
       }
       else
         tstatus = 0;

     /*  CRPIXn  - Reference Pixel  */
       ffkeyn("TCRPX", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0; /* choose first pixel in new image as ref. pix. */
         tstatus = 0;
       }
       else
       {
           /* calculate locate of the ref. pix. in the new image */
           dvalue = (dvalue - amin[ii]) / binsize[ii] + .5;
       }

       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

     /*  CRVALn - Value at the location of the reference pixel */
       ffkeyn("TCRVL", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         /* calculate value at ref. pix. location (at center of 1st pixel) */
         dvalue = amin[ii] + binsize[ii]/2.;
         tstatus = 0;
       }

       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

     /*  CDELTn - unit size of pixels  */
       ffkeyn("TCDLT", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0;  /* use default pixel size */
         tstatus = 0;
       }

       dvalue = dvalue * binsize[ii];
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

     /*  CROTAn - Rotation angle (degrees CCW)  */
     /*  There should only be a CROTA2 keyword, and only for 2+ D images */
       if (ii == 1)
       {
         ffkeyn("TCROT", histData.hcolnum[ii], keyname, &tstatus);
         ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
         if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
         {
           ffkeyn("CROTA", ii + 1, keyname, &tstatus);
           ffpky(histptr, TDOUBLE, keyname, &dvalue,
                 "Rotation angle", &tstatus);
         }
         else
         {
            /* didn't find CROTA for the 2nd axis, so look for one */
            /* on the first axis */
           tstatus = 0;
           ffkeyn("TCROT", histData.hcolnum[0], keyname, &tstatus);
           ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
           if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
           {
             dvalue *= -1.;   /* negate the value, because mirror image */
             ffkeyn("CROTA", ii + 1, keyname, &tstatus);
             ffpky(histptr, TDOUBLE, keyname, &dvalue,
                   "Rotation angle", &tstatus);
           }
         }
       }
    }

    /* convert any TPn_k keywords to PCi_j; the value remains unchanged */
    /* also convert any TCn_k to CDi_j; the value is modified by n binning size */
    /* This is a bit of a kludge, and only works for 2D WCS */

    if (histData.haxis == 2) {

      /* PC1_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_1", &dvalue, card, &tstatus);

      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[0];
         ffpky(histptr, TDOUBLE, "CD1_1", &dvalue, card, &tstatus);
      }

      /* PC1_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_2", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
        dvalue *=  binsize[0];
        ffpky(histptr, TDOUBLE, "CD1_2", &dvalue, card, &tstatus);
      }
       
      /* PC2_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_1", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_1", &dvalue, card, &tstatus);
      }
       
       /* PC2_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_2", &dvalue, card, &tstatus);
        
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_2", &dvalue, card, &tstatus);
      }
    }   
       
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

    return(*status);
}